

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall QMdiSubWindow::~QMdiSubWindow(QMdiSubWindow *this)

{
  QMdiSubWindowPrivate *this_00;
  Data *pDVar1;
  QObject *pQVar2;
  
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007f6570;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QMdiSubWindow_007f6720;
  this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  QMdiSubWindowPrivate::removeButtonsFromMenuBar(this_00);
  QMdiSubWindowPrivate::setActive(this_00,false,true);
  pDVar1 = (this_00->controlContainer).wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     (pQVar2 = (this_00->controlContainer).wp.value, pQVar2 != (QObject *)0x0)) {
    (**(code **)(*(long *)pQVar2 + 0x20))();
  }
  QWidget::~QWidget(&this->super_QWidget);
  return;
}

Assistant:

QMdiSubWindow::~QMdiSubWindow()
{
    Q_D(QMdiSubWindow);
#if QT_CONFIG(menubar)
    d->removeButtonsFromMenuBar();
#endif
    d->setActive(false);
    delete d->controlContainer;
}